

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

Result __thiscall
spectest::JSONParser::ParseF64Value
          (JSONParser *this,uint64_t *out_value,ExpectedNan *out_nan,string_view value_str,
          AllowExpected allow_expected)

{
  int iVar1;
  Result RVar2;
  size_t sVar3;
  char *s;
  size_type __rlen;
  
  s = value_str._M_str;
  sVar3 = value_str._M_len;
  if (allow_expected == Yes) {
    *out_value = 0;
    if (sVar3 == 0xe) {
      iVar1 = bcmp(s,"nan:arithmetic",0xe);
      if (iVar1 == 0) {
        *out_nan = Arithmetic;
        return (Result)Ok;
      }
    }
    else if ((sVar3 == 0xd) && (iVar1 = bcmp(s,"nan:canonical",0xd), iVar1 == 0)) {
      *out_nan = Canonical;
      return (Result)Ok;
    }
  }
  *out_nan = None;
  RVar2 = wabt::ParseInt64(s,s + sVar3,out_value,UnsignedOnly);
  if (RVar2.enum_ == Error) {
    PrintError(this,"invalid f64 literal");
  }
  return (Result)(uint)(RVar2.enum_ == Error);
}

Assistant:

wabt::Result JSONParser::ParseF64Value(uint64_t* out_value,
                                       ExpectedNan* out_nan,
                                       std::string_view value_str,
                                       AllowExpected allow_expected) {
  if (allow_expected == AllowExpected::Yes) {
    *out_value = 0;
    if (value_str == "nan:canonical") {
      *out_nan = ExpectedNan::Canonical;
      return wabt::Result::Ok;
    } else if (value_str == "nan:arithmetic") {
      *out_nan = ExpectedNan::Arithmetic;
      return wabt::Result::Ok;
    }
  }

  *out_nan = ExpectedNan::None;
  if (Failed(ParseInt64(value_str, out_value, ParseIntType::UnsignedOnly))) {
    PrintError("invalid f64 literal");
    return wabt::Result::Error;
  }
  return wabt::Result::Ok;
}